

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
         *this)

{
  FloatFormat *fmt;
  double *pdVar1;
  _Base_ptr p_Var2;
  ostringstream *poVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  float fVar5;
  Precision PVar6;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar7;
  Statement *pSVar8;
  ShaderExecutor *pSVar9;
  Variable<tcu::Vector<float,_3>_> *pVVar10;
  pointer pcVar11;
  Variable<float> *pVVar12;
  TestLog *pTVar13;
  TestStatus *pTVar14;
  pointer pVVar15;
  bool bVar16;
  int iVar17;
  undefined8 uVar18;
  long lVar19;
  IVal *pIVar20;
  IVal *x;
  undefined8 *puVar21;
  uint uVar22;
  Vector<float,_3> *val;
  long lVar23;
  char *pcVar24;
  undefined1 auVar25 [8];
  IVal IVar26;
  byte bVar27;
  double dVar28;
  double dVar29;
  FuncSet funcs;
  IVal reference1;
  IVal in2;
  IVal in3;
  IVal in0;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_> outputs;
  FloatFormat highpFmt;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ostringstream oss;
  ResultCollector status;
  deUint32 in_stack_fffffffffffffab8;
  Vector<float,_3> *local_540;
  undefined1 local_538 [8];
  undefined8 local_530;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_528;
  _Rb_tree_node_base *local_518;
  size_t local_510;
  IVal local_501;
  TestLog *local_500;
  float *local_4f8;
  size_t local_4f0;
  string local_4e8;
  TestLog *local_4c8;
  double dStack_4c0;
  _Base_ptr local_4b8;
  long local_4a8;
  TestStatus *local_4a0;
  undefined1 local_498 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  double local_478;
  Precision local_470;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_468;
  undefined4 local_460;
  ios_base local_428 [8];
  ios_base local_420 [264];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_318;
  Outputs<vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_> local_2e8;
  FloatFormat local_2b8;
  pointer local_288;
  pointer local_280;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_278;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  IVal local_1f8;
  ios_base local_188 [264];
  ResultCollector local_80;
  
  bVar27 = 0;
  this_00 = this->m_samplings;
  fmt = &(this->m_caseCtx).floatFormat;
  PVar6 = (this->m_caseCtx).precision;
  sVar7 = (this->m_caseCtx).numRandoms;
  local_4a0 = __return_storage_ptr__;
  iVar17 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,3>,tcu::Vector<float,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_278,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)fmt,(FloatFormat *)(ulong)PVar6,(Precision)sVar7,(ulong)(iVar17 + 0xdeadbeef),
             in_stack_fffffffffffffab8);
  pVVar15 = local_278.in0.
            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_4f0 = ((long)local_278.in0.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_278.in0.
                     super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  Outputs<vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>::Outputs
            (&local_2e8,local_4f0);
  local_4f8 = pVVar15->m_data;
  local_2b8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_2b8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_2b8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_2b8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_2b8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_2b8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_2b8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_2b8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_2b8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_318._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_318._M_impl.super__Rb_tree_header._M_header;
  local_318._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_318._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_318._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_318._M_impl.super__Rb_tree_header._M_header._M_right =
       local_318._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_80);
  local_500 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_278.in0.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_210 = local_278.in1.
              super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_208 = local_278.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_278.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_288 = local_2e8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_280 = local_2e8.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar3 = (ostringstream *)(local_498 + 8);
  local_498._0_8_ = local_500;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar3,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_420);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
  local_530 = (double)((ulong)local_530._4_4_ << 0x20);
  local_528._M_allocated_capacity = 0;
  local_510 = 0;
  pSVar8 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_528._8_8_ = (_Rb_tree_node_base *)&local_530;
  local_518 = (_Rb_tree_node_base *)&local_530;
  (*pSVar8->_vptr_Statement[4])(pSVar8,local_538);
  if ((_Rb_tree_node_base *)local_528._8_8_ != (_Rb_tree_node_base *)&local_530) {
    uVar18 = local_528._8_8_;
    do {
      (**(code **)(**(long **)(uVar18 + 0x20) + 0x30))(*(long **)(uVar18 + 0x20),&local_1f8);
      uVar18 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar18);
    } while ((_Rb_tree_node_base *)uVar18 != (_Rb_tree_node_base *)&local_530);
  }
  if (local_510 != 0) {
    poVar3 = (ostringstream *)(local_498 + 8);
    local_498._0_8_ = local_500;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,local_4e8._M_dataplus._M_p,local_4e8._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
      operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_420);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_538);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
  std::ios_base::~ios_base(local_188);
  pSVar9 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar9->_vptr_ShaderExecutor[2])(pSVar9,local_4f0,&local_218,&local_288,0);
  lVar19 = 0x10;
  do {
    *(undefined1 *)((long)&local_4a8 + lVar19) = 0;
    *(undefined8 *)((long)&local_4a0 + lVar19) = 0x7ff0000000000000;
    *(undefined8 *)(local_498 + lVar19) = 0xfff0000000000000;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x58);
  lVar19 = 0x10;
  do {
    *(undefined1 *)((long)&local_4a8 + lVar19) = 0;
    *(undefined8 *)((long)&local_4a0 + lVar19) = 0x7ff0000000000000;
    *(undefined8 *)(local_498 + lVar19) = 0xfff0000000000000;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x58);
  lVar19 = 0x10;
  do {
    *(undefined1 *)((long)&local_208 + lVar19) = 0;
    *(undefined8 *)((long)&local_200 + lVar19) = 0x7ff0000000000000;
    *(undefined8 *)(&local_1f8.m_data[0].m_hasNaN + lVar19) = 0xfff0000000000000;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x58);
  lVar19 = 0x10;
  do {
    *(undefined1 *)((long)&local_208 + lVar19) = 0;
    *(undefined8 *)((long)&local_200 + lVar19) = 0x7ff0000000000000;
    *(undefined8 *)(&local_1f8.m_data[0].m_hasNaN + lVar19) = 0xfff0000000000000;
    lVar19 = lVar19 + 0x18;
  } while (lVar19 != 0x58);
  local_538 = (undefined1  [8])((ulong)local_538 & 0xffffffffffffff00);
  local_530 = INFINITY;
  local_528._M_allocated_capacity = 0xfff0000000000000;
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_318,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.m_ptr,
             (IVal *)local_498);
  Environment::bind<tcu::Vector<float,3>>
            ((Environment *)&local_318,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.m_ptr,
             &local_1f8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_318,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4e8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_318,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4c8);
  Environment::bind<float>
            ((Environment *)&local_318,
             (this->m_variables).out0.super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
             m_ptr,(IVal *)local_538);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_318,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_501);
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_finish == (pointer)local_4f8) {
    local_540._0_4_ = 0;
    uVar22 = (uint)local_540;
  }
  else {
    lVar19 = local_4f0 + (local_4f0 == 0);
    local_4f8 = (float *)0x0;
    lVar23 = 0;
    local_540 = (Vector<float,_3> *)0x0;
    do {
      local_4c8 = (TestLog *)((ulong)local_4c8 & 0xffffffffffffff00);
      dStack_4c0 = INFINITY;
      local_4b8 = (_Base_ptr)0xfff0000000000000;
      local_538 = *(undefined1 (*) [8])
                   ((long)(local_278.in0.
                           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar23);
      local_4a8 = lVar19;
      local_530._0_4_ =
           *(float *)((long)(local_278.in0.
                             super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar23 + 8);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doRound
                (&local_1f8,fmt,(Vector<float,_3> *)local_538);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_498,fmt,&local_1f8);
      pIVar20 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_318,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      puVar21 = (undefined8 *)local_498;
      for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
        *(undefined8 *)pIVar20->m_data = *puVar21;
        puVar21 = puVar21 + (ulong)bVar27 * -2 + 1;
        pIVar20 = (IVal *)((long)pIVar20 + ((ulong)bVar27 * -2 + 1) * 8);
      }
      local_530 = (double)CONCAT44(local_530._4_4_,
                                   *(undefined4 *)
                                    ((long)(local_278.in1.
                                            super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->m_data +
                                    lVar23 + 8));
      local_538 = *(undefined1 (*) [8])
                   ((long)(local_278.in1.
                           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar23);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doRound
                (&local_1f8,fmt,(Vector<float,_3> *)local_538);
      ContainerTraits<tcu::Vector<float,_3>,_tcu::Vector<tcu::Interval,_3>_>::doConvert
                ((IVal *)local_498,fmt,&local_1f8);
      pIVar20 = Environment::lookup<tcu::Vector<float,3>>
                          ((Environment *)&local_318,
                           (this->m_variables).in1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>
                           .m_ptr);
      puVar21 = (undefined8 *)local_498;
      for (lVar19 = 9; lVar19 != 0; lVar19 = lVar19 + -1) {
        *(undefined8 *)pIVar20->m_data = *puVar21;
        puVar21 = puVar21 + (ulong)bVar27 * -2 + 1;
        pIVar20 = (IVal *)((long)pIVar20 + ((ulong)bVar27 * -2 + 1) * 8);
      }
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_318,
                 (this->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_318,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_470 = (this->m_caseCtx).precision;
      local_478 = (this->m_caseCtx).floatFormat.m_maxValue;
      local_498._0_8_ = *(undefined8 *)fmt;
      local_498._8_4_ = (this->m_caseCtx).floatFormat.m_fractionBits;
      local_498._12_4_ = (this->m_caseCtx).floatFormat.m_hasSubnormal;
      local_488._M_allocated_capacity = *(undefined8 *)&(this->m_caseCtx).floatFormat.m_hasInf;
      local_488._8_1_ = (this->m_caseCtx).floatFormat.m_exactPrecision;
      local_488._9_7_ = *(undefined7 *)&(this->m_caseCtx).floatFormat.field_0x19;
      local_460 = 0;
      pSVar8 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_468 = &local_318;
      (*pSVar8->_vptr_Statement[3])(pSVar8,local_498);
      x = Environment::lookup<float>
                    ((Environment *)&local_318,
                     (this->m_variables).out0.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr);
      tcu::FloatFormat::convert((Interval *)local_498,&local_2b8,x);
      local_4b8 = (_Base_ptr)local_488._M_allocated_capacity;
      dStack_4c0 = (double)CONCAT44(local_498._12_4_,local_498._8_4_);
      local_4c8 = (TestLog *)local_498._0_8_;
      pTVar13 = local_4c8;
      fVar5 = *(float *)((long)local_2e8.out0.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start + (long)local_4f8);
      dVar28 = (double)fVar5;
      dVar29 = dVar28;
      if (NAN(fVar5)) {
        dVar29 = INFINITY;
        dVar28 = -INFINITY;
      }
      IVar26 = (IVal)(dVar28 <= (double)local_488._M_allocated_capacity && dStack_4c0 <= dVar29);
      if ((NAN(fVar5)) &&
         (dVar28 <= (double)local_488._M_allocated_capacity && dStack_4c0 <= dVar29)) {
        local_4c8._0_1_ = SUB81(local_498._0_8_,0);
        IVar26 = local_4c8._0_1_;
      }
      local_498._0_8_ = local_498 + 0x10;
      local_4c8 = pTVar13;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_498,"Shader output 0 is outside acceptable range","");
      bVar16 = tcu::ResultCollector::check(&local_80,(bool)((byte)IVar26 & 1),(string *)local_498);
      if ((TestLog *)local_498._0_8_ != (TestLog *)(local_498 + 0x10)) {
        operator_delete((void *)local_498._0_8_,(ulong)(local_488._M_allocated_capacity + 1));
      }
      uVar22 = (int)local_540 + ((byte)~bVar16 & 1);
      local_540 = (Vector<float,_3> *)(ulong)uVar22;
      if ((int)uVar22 < 0x65 && !bVar16) {
        local_498._0_8_ = local_500;
        poVar3 = (ostringstream *)(local_498 + 8);
        val = local_540;
        std::__cxx11::ostringstream::ostringstream(poVar3);
        pcVar24 = "Failed";
        if (bVar16) {
          pcVar24 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,pcVar24,6);
        pdVar1 = &local_1f8.m_data[0].m_hi;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
        pVVar10 = (this->m_variables).in0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.
                  m_ptr;
        pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
        local_1f8.m_data[0]._0_8_ = pdVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f8,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)local_1f8.m_data[0]._0_8_,
                   (long)local_1f8.m_data[0].m_lo);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
        valueToString<tcu::Vector<float,3>>
                  ((string *)local_538,(shaderexecutor *)&local_2b8,
                   (FloatFormat *)
                   ((long)(local_278.in0.
                           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar23),val);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)local_538,(long)local_530);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        if (local_538 != (undefined1  [8])&local_528) {
          operator_delete((void *)local_538,(ulong)(local_528._M_allocated_capacity + 1));
        }
        if ((double *)local_1f8.m_data[0]._0_8_ != pdVar1) {
          operator_delete((void *)local_1f8.m_data[0]._0_8_,(long)local_1f8.m_data[0].m_hi + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
        pVVar10 = (this->m_variables).in1.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_3>_>_>.
                  m_ptr;
        pcVar11 = (pVVar10->m_name)._M_dataplus._M_p;
        local_1f8.m_data[0]._0_8_ = pdVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f8,pcVar11,pcVar11 + (pVVar10->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)local_1f8.m_data[0]._0_8_,
                   (long)local_1f8.m_data[0].m_lo);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
        valueToString<tcu::Vector<float,3>>
                  ((string *)local_538,(shaderexecutor *)&local_2b8,
                   (FloatFormat *)
                   ((long)(local_278.in1.
                           super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar23),val);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)local_538,(long)local_530);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        if (local_538 != (undefined1  [8])&local_528) {
          operator_delete((void *)local_538,(ulong)(local_528._M_allocated_capacity + 1));
        }
        if ((double *)local_1f8.m_data[0]._0_8_ != pdVar1) {
          operator_delete((void *)local_1f8.m_data[0]._0_8_,(long)local_1f8.m_data[0].m_hi + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
        pVVar12 = (this->m_variables).out0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr;
        pcVar11 = (pVVar12->m_name)._M_dataplus._M_p;
        local_1f8.m_data[0]._0_8_ = pdVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f8,pcVar11,pcVar11 + (pVVar12->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)local_1f8.m_data[0]._0_8_,
                   (long)local_1f8.m_data[0].m_lo);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
        valueToString<float>
                  ((string *)local_538,&local_2b8,
                   (float *)((long)local_2e8.out0.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + (long)local_4f8));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)local_538,(long)local_530);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,"\tExpected range: ",0x11);
        intervalToString<float>(&local_4e8,&local_2b8,(IVal *)&local_4c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,local_4e8._M_dataplus._M_p,local_4e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
          operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
        }
        if (local_538 != (undefined1  [8])&local_528) {
          operator_delete((void *)local_538,(ulong)(local_528._M_allocated_capacity + 1));
        }
        if ((double *)local_1f8.m_data[0]._0_8_ != pdVar1) {
          operator_delete((void *)local_1f8.m_data[0]._0_8_,(long)local_1f8.m_data[0].m_hi + 1);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar3);
        std::ios_base::~ios_base(local_420);
      }
      lVar23 = lVar23 + 0xc;
      local_4f8 = local_4f8 + 1;
      lVar19 = local_4a8 + -1;
    } while (lVar19 != 0);
  }
  local_540._0_4_ = uVar22;
  pTVar14 = local_4a0;
  if (100 < (int)(uint)local_540) {
    poVar3 = (ostringstream *)(local_498 + 8);
    local_498._0_8_ = local_500;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"(Skipped ",9);
    std::ostream::operator<<(poVar3,(uint)local_540 - 100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_420);
  }
  if ((uint)local_540 == 0) {
    poVar3 = (ostringstream *)(local_498 + 8);
    local_498._0_8_ = local_500;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    poVar3 = (ostringstream *)(local_498 + 8);
    local_498._0_8_ = local_500;
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::ostream::operator<<(poVar3,(uint)local_540);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_498,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_498 + 8));
  std::ios_base::~ios_base(local_420);
  if ((uint)local_540 == 0) {
    local_498._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_498 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"Pass","");
    pTVar14->m_code = QP_TEST_RESULT_PASS;
    (pTVar14->m_description)._M_dataplus._M_p = (pointer)&(pTVar14->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar14->m_description,local_498._0_8_,
               (char *)(local_498._0_8_ + CONCAT44(local_498._12_4_,local_498._8_4_)));
    uVar18 = local_488._M_allocated_capacity;
    auVar25 = (undefined1  [8])local_498._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_498 + 0x10)) goto LAB_00884e8f;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
    std::ostream::operator<<(local_498,(uint)local_540);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
    std::ios_base::~ios_base(local_428);
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_498 + 0x10);
    local_498._0_8_ = paVar4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_498," test failed. Check log for the details","");
    p_Var2 = (_Base_ptr)(CONCAT44(local_498._12_4_,local_498._8_4_) + (long)local_530);
    uVar18 = (_Base_ptr)0xf;
    if (local_538 != (undefined1  [8])&local_528) {
      uVar18 = local_528._M_allocated_capacity;
    }
    if ((ulong)uVar18 < p_Var2) {
      uVar18 = (_Base_ptr)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._0_8_ != paVar4) {
        uVar18 = local_488._M_allocated_capacity;
      }
      if ((ulong)uVar18 < p_Var2) goto LAB_00884d24;
      puVar21 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_498,0,(char *)0x0,(ulong)local_538);
    }
    else {
LAB_00884d24:
      puVar21 = (undefined8 *)std::__cxx11::string::_M_append(local_538,local_498._0_8_);
    }
    local_1f8.m_data[0]._0_8_ = &local_1f8.m_data[0].m_hi;
    pdVar1 = (double *)(puVar21 + 2);
    if ((double *)*puVar21 == pdVar1) {
      local_1f8.m_data[0].m_hi = *pdVar1;
      local_1f8.m_data[1]._0_4_ = *(undefined4 *)(puVar21 + 3);
      local_1f8.m_data[1]._4_4_ = *(undefined4 *)((long)puVar21 + 0x1c);
    }
    else {
      local_1f8.m_data[0].m_hi = *pdVar1;
      local_1f8.m_data[0]._0_8_ = (double *)*puVar21;
    }
    local_1f8.m_data[0].m_lo = (double)puVar21[1];
    *puVar21 = pdVar1;
    puVar21[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar14->m_code = QP_TEST_RESULT_FAIL;
    (pTVar14->m_description)._M_dataplus._M_p = (pointer)&(pTVar14->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar14->m_description,local_1f8.m_data[0]._0_8_,
               (undefined1 *)((long)local_1f8.m_data[0].m_lo + local_1f8.m_data[0]._0_8_));
    if ((double *)local_1f8.m_data[0]._0_8_ != &local_1f8.m_data[0].m_hi) {
      operator_delete((void *)local_1f8.m_data[0]._0_8_,(long)local_1f8.m_data[0].m_hi + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._0_8_ != paVar4) {
      operator_delete((void *)local_498._0_8_,(ulong)(local_488._M_allocated_capacity + 1));
    }
    uVar18 = local_528._M_allocated_capacity;
    auVar25 = local_538;
    if (local_538 == (undefined1  [8])&local_528) goto LAB_00884e8f;
  }
  operator_delete((void *)auVar25,(ulong)((long)&((_Base_ptr)uVar18)->_M_color + 1));
LAB_00884e8f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_318);
  if (local_2e8.out1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.out1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2e8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2e8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2e8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_278.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in1.
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in1.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in1.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in1.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in0.
                    super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_3>,_std::allocator<tcu::Vector<float,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar14;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}